

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void highbd_masked_variance4xh
               (uint16_t *src_ptr,int src_stride,uint16_t *a_ptr,uint16_t *b_ptr,uint8_t *m_ptr,
               int m_stride,int height,int *sse,int *sum_)

{
  uint16_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  long lVar27;
  undefined1 auVar28 [16];
  int iVar30;
  int iVar31;
  undefined1 auVar29 [16];
  int iVar32;
  ushort uVar33;
  ulong uVar34;
  undefined1 uVar37;
  short sVar36;
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar29 = (undefined1  [16])0x0;
  auVar28 = (undefined1  [16])0x0;
  for (lVar27 = 0; (int)lVar27 < height; lVar27 = lVar27 + 2) {
    uVar2 = *(ulong *)src_ptr;
    uVar3 = *(ulong *)((long)src_ptr + (long)src_stride * 2);
    auVar35 = *(undefined1 (*) [16])(a_ptr + lVar27 * 4);
    puVar1 = b_ptr + lVar27 * 4;
    uVar4 = *(undefined4 *)(m_ptr + m_stride);
    uVar5 = *(undefined4 *)m_ptr;
    uVar34 = CONCAT44(uVar4,uVar5);
    uVar37 = (undefined1)((uint)uVar4 >> 0x18);
    auVar6._8_6_ = 0;
    auVar6._0_8_ = uVar34;
    auVar6[0xe] = uVar37;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar34;
    auVar9[0xc] = (char)((uint)uVar4 >> 0x10);
    auVar9._13_2_ = auVar6._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar34;
    auVar12._12_3_ = auVar9._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar34;
    auVar13[10] = (char)((uint)uVar4 >> 8);
    auVar13._11_4_ = auVar12._11_4_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = uVar34;
    auVar16._10_5_ = auVar13._10_5_;
    auVar17[8] = (char)uVar4;
    auVar17._0_8_ = uVar34;
    auVar17._9_6_ = auVar16._9_6_;
    auVar21._7_8_ = 0;
    auVar21._0_7_ = auVar17._8_7_;
    Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),(char)((uint)uVar5 >> 0x18));
    auVar26._9_6_ = 0;
    auVar26._0_9_ = Var22;
    auVar18[4] = (char)((uint)uVar5 >> 0x10);
    auVar18._0_4_ = uVar5;
    auVar18._5_10_ = SUB1510(auVar26 << 0x30,5);
    auVar23._11_4_ = 0;
    auVar23._0_11_ = auVar18._4_11_;
    uVar33 = (ushort)uVar5;
    auVar19[2] = (char)((uint)uVar5 >> 8);
    auVar19._0_2_ = uVar33;
    auVar19._3_12_ = SUB1512(auVar23 << 0x20,3);
    auVar20._2_13_ = auVar19._2_13_;
    auVar20._0_2_ = uVar33 & 0xff;
    sVar36 = (short)Var22;
    auVar48._0_12_ = auVar35._0_12_;
    auVar48._12_2_ = auVar35._6_2_;
    auVar48._14_2_ = puVar1[3];
    auVar47._12_4_ = auVar48._12_4_;
    auVar47._0_10_ = auVar35._0_10_;
    auVar47._10_2_ = puVar1[2];
    auVar46._10_6_ = auVar47._10_6_;
    auVar46._0_8_ = auVar35._0_8_;
    auVar46._8_2_ = auVar35._4_2_;
    auVar45._8_8_ = auVar46._8_8_;
    auVar45._6_2_ = puVar1[1];
    auVar45._4_2_ = auVar35._2_2_;
    auVar45._0_2_ = auVar35._0_2_;
    auVar45._2_2_ = *puVar1;
    auVar40._0_12_ = auVar20._0_12_;
    auVar40._12_2_ = sVar36;
    auVar40._14_2_ = 0x40 - sVar36;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = auVar20._0_10_;
    auVar39._10_2_ = 0x40 - auVar18._4_2_;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._8_2_ = auVar18._4_2_;
    auVar38._6_2_ = 0x40 - auVar19._2_2_;
    auVar38._4_2_ = auVar19._2_2_;
    auVar38._0_4_ = CONCAT22(0x40 - (uVar33 & 0xff),uVar33) & 0xffff00ff;
    auVar41 = pmaddwd(auVar38,auVar45);
    auVar44._2_2_ = puVar1[4];
    auVar44._0_2_ = auVar35._8_2_;
    auVar44._4_2_ = auVar35._10_2_;
    auVar44._6_2_ = puVar1[5];
    auVar44._8_2_ = auVar35._12_2_;
    auVar44._10_2_ = puVar1[6];
    auVar44._12_2_ = auVar35._14_2_;
    auVar44._14_2_ = puVar1[7];
    auVar43._2_2_ = 0x40 - auVar17._8_2_;
    auVar43._0_2_ = auVar17._8_2_;
    auVar43._4_2_ = auVar13._10_2_;
    auVar43._6_2_ = 0x40 - auVar13._10_2_;
    auVar43._8_2_ = auVar9._12_2_;
    auVar43._10_2_ = 0x40 - auVar9._12_2_;
    auVar43[0xc] = uVar37;
    auVar43[0xd] = 0;
    auVar43._14_2_ = 0x40 - (auVar6._13_2_ >> 8);
    auVar35 = pmaddwd(auVar43,auVar44);
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar2;
    auVar7._12_2_ = (short)(uVar2 >> 0x30);
    auVar10._8_2_ = (short)(uVar2 >> 0x20);
    auVar10._0_8_ = uVar2;
    auVar10._10_4_ = auVar7._10_4_;
    auVar24._6_8_ = 0;
    auVar24._0_6_ = auVar10._8_6_;
    auVar14._4_2_ = (short)(uVar2 >> 0x10);
    auVar14._0_4_ = (uint)uVar2;
    auVar14._6_8_ = SUB148(auVar24 << 0x40,6);
    auVar42._0_4_ = (auVar41._0_4_ + 0x20 >> 6) - ((uint)uVar2 & 0xffff);
    auVar42._4_4_ = (auVar41._4_4_ + 0x20 >> 6) - auVar14._4_4_;
    auVar42._8_4_ = (auVar41._8_4_ + 0x20 >> 6) - auVar10._8_4_;
    auVar42._12_4_ = (auVar41._12_4_ + 0x20 >> 6) - (auVar7._10_4_ >> 0x10);
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar3;
    auVar8._12_2_ = (short)(uVar3 >> 0x30);
    auVar11._8_2_ = (short)(uVar3 >> 0x20);
    auVar11._0_8_ = uVar3;
    auVar11._10_4_ = auVar8._10_4_;
    auVar25._6_8_ = 0;
    auVar25._0_6_ = auVar11._8_6_;
    auVar15._4_2_ = (short)(uVar3 >> 0x10);
    auVar15._0_4_ = (uint)uVar3;
    auVar15._6_8_ = SUB148(auVar25 << 0x40,6);
    auVar41._0_4_ = (auVar35._0_4_ + 0x20 >> 6) - ((uint)uVar3 & 0xffff);
    auVar41._4_4_ = (auVar35._4_4_ + 0x20 >> 6) - auVar15._4_4_;
    auVar41._8_4_ = (auVar35._8_4_ + 0x20 >> 6) - auVar11._8_4_;
    auVar41._12_4_ = (auVar35._12_4_ + 0x20 >> 6) - (auVar8._10_4_ >> 0x10);
    iVar30 = auVar29._4_4_;
    iVar31 = auVar29._8_4_;
    iVar32 = auVar29._12_4_;
    auVar29._0_4_ = auVar29._0_4_ + auVar42._0_4_ + auVar41._0_4_;
    auVar29._4_4_ = iVar30 + auVar42._4_4_ + auVar41._4_4_;
    auVar29._8_4_ = iVar31 + auVar42._8_4_ + auVar41._8_4_;
    auVar29._12_4_ = iVar32 + auVar42._12_4_ + auVar41._12_4_;
    auVar35 = packssdw(auVar42,auVar41);
    auVar43 = pmaddwd(auVar35,auVar35);
    auVar35._0_4_ = auVar28._0_4_ + auVar43._0_4_;
    auVar35._4_4_ = auVar28._4_4_ + auVar43._4_4_;
    auVar35._8_4_ = auVar28._8_4_ + auVar43._8_4_;
    auVar35._12_4_ = auVar28._12_4_ + auVar43._12_4_;
    m_ptr = m_ptr + m_stride * 2;
    src_ptr = (uint16_t *)((long)src_ptr + (long)(src_stride * 2) * 2);
    auVar28 = auVar35;
  }
  auVar29 = phaddd(auVar29,auVar28);
  auVar29 = phaddd(auVar29,auVar28);
  *sum_ = auVar29._0_4_;
  auVar28 = phaddd(auVar28,auVar28);
  auVar28 = phaddd(auVar28,auVar28);
  *sse = auVar28._0_4_;
  return;
}

Assistant:

static void highbd_masked_variance4xh(const uint16_t *src_ptr, int src_stride,
                                      const uint16_t *a_ptr,
                                      const uint16_t *b_ptr,
                                      const uint8_t *m_ptr, int m_stride,
                                      int height, int *sse, int *sum_) {
  int y;
  // Note: For this function, h <= 8 (or maybe 16 if we add 4:1 partitions).
  // So the maximum value of sum is (2^12 - 1) * 4 * 16 =~ 2^18
  // and the maximum value of sum_sq is (2^12 - 1)^2 * 4 * 16 =~ 2^30.
  // So we can safely pack sum_sq into 32-bit fields, which is slightly more
  // convenient.
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  for (y = 0; y < height; y += 2) {
    __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m = _mm_unpacklo_epi8(
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(const int *)m_ptr),
                           _mm_cvtsi32_si128(*(const int *)&m_ptr[m_stride])),
        zero);
    const __m128i m_inv = _mm_sub_epi16(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi16(a, b);
    const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
    __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
    pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpackhi_epi16(a, b);
    const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
    __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
    pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i src_l = _mm_unpacklo_epi16(src, zero);
    const __m128i src_r = _mm_unpackhi_epi16(src, zero);
    __m128i diff_l = _mm_sub_epi32(pred_l, src_l);
    __m128i diff_r = _mm_sub_epi32(pred_r, src_r);

    // Update partial sums and partial sums of squares
    sum = _mm_add_epi32(sum, _mm_add_epi32(diff_l, diff_r));
    const __m128i tmp = _mm_packs_epi32(diff_l, diff_r);
    const __m128i prod = _mm_madd_epi16(tmp, tmp);
    sum_sq = _mm_add_epi32(sum_sq, prod);

    src_ptr += src_stride * 2;
    a_ptr += 8;
    b_ptr += 8;
    m_ptr += m_stride * 2;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, zero);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}